

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O3

void __thiscall CTextRender::TextNewline(CTextRender *this,CTextCursor *pCursor)

{
  int iVar1;
  IGraphics *pIVar2;
  int iVar3;
  long in_FS_OFFSET;
  float fVar4;
  float fVar5;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  float local_28;
  undefined1 local_24 [4];
  float local_20;
  undefined1 local_1c [4];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pCursor->m_Truncated == false) && (pCursor->m_SkipTextRender == false)) {
    pIVar2 = this->m_pGraphics;
    iVar1 = pIVar2->m_ScreenHeight;
    (*(pIVar2->super_IInterface)._vptr_IInterface[6])(pIVar2,local_1c,&local_20,local_24,&local_28);
    iVar3 = pCursor->m_MaxLines;
    if (iVar3 < 0) {
      iVar3 = (int)((local_28 - local_20) / pCursor->m_FontSize);
    }
    if (pCursor->m_LineCount < iVar3) {
      fVar4 = (float)iVar1 / (local_28 - local_20);
      fVar5 = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
      iVar3 = pCursor->m_LineCount + 1;
      (pCursor->m_Advance).field_1.y = fVar5;
      (pCursor->m_Advance).field_0.x = 0.0;
      pCursor->m_StartOfLine = true;
      pCursor->m_NextLineAdvanceY = (float)(int)((fVar5 + pCursor->m_FontSize) * fVar4) / fVar4;
    }
    else {
      pCursor->m_Truncated = true;
    }
    pCursor->m_LineCount = iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTextRender::TextNewline(CTextCursor *pCursor)
{
	if(pCursor->m_Truncated || pCursor->m_SkipTextRender)
		return;

	// Alignment
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	int ScreenWidth = Graphics()->ScreenWidth();
	int ScreenHeight = Graphics()->ScreenHeight();
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	int MaxLines = pCursor->m_MaxLines;
	if(MaxLines < 0)
		MaxLines = (ScreenY1-ScreenY0) / pCursor->m_FontSize;

	if(pCursor->m_LineCount >= MaxLines)
	{
		pCursor->m_LineCount = MaxLines;
		pCursor->m_Truncated = true;
		return;
	}

	vec2 ScreenScale = vec2(ScreenWidth/(ScreenX1-ScreenX0), ScreenHeight/(ScreenY1-ScreenY0));
	float Size = pCursor->m_FontSize;
	int PixelSize = (int)(Size * ScreenScale.y);
	Size = PixelSize / ScreenScale.y;

	pCursor->m_LineCount++;
	pCursor->m_Advance.y = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
	pCursor->m_Advance.x = 0;
	pCursor->m_StartOfLine = true;
	float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
	NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
	pCursor->m_NextLineAdvanceY = NextAdvanceY;
}